

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O2

int __thiscall QHexView::visibleLines(QHexView *this,bool absolute)

{
  int iVar1;
  int iVar2;
  long lVar3;
  quint64 qVar4;
  undefined3 in_register_00000031;
  double dVar5;
  
  lVar3 = QAbstractScrollArea::viewport();
  iVar1 = *(int *)(*(long *)(lVar3 + 0x20) + 0x20);
  iVar2 = *(int *)(*(long *)(lVar3 + 0x20) + 0x18);
  dVar5 = (double)QFontMetricsF::height();
  dVar5 = ceil((double)((iVar1 - iVar2) + 1) / dVar5);
  iVar1 = (int)dVar5 + -1;
  if (((this->m_options).flags & 0x20) != 0) {
    iVar1 = (int)dVar5;
  }
  iVar2 = iVar1;
  if (CONCAT31(in_register_00000031,absolute) == 0) {
    qVar4 = lines(this);
    iVar2 = (int)qVar4;
    if (iVar1 < (int)qVar4) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

int QHexView::visibleLines(bool absolute) const {
    int vl = static_cast<int>(
        qCeil(this->viewport()->height() / this->lineHeight()));
    if(!m_options.hasFlag(QHexFlags::NoHeader))
        vl--;
    return absolute ? vl : qMin<int>(this->lines(), vl);
}